

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_hashmap.c
# Opt level: O0

int SUNHashMap_Insert(SUNHashMap map,char *key,void *value)

{
  int iVar1;
  uint64_t uVar2;
  undefined8 *puVar3;
  long in_RDX;
  SUNHashMap in_RSI;
  int *in_RDI;
  SUNHashMapKeyValue kvp;
  int retval;
  int idx;
  void *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (((in_RDI == (int *)0x0) || (in_RSI == (SUNHashMap)0x0)) || (in_RDX == 0)) {
    return -1;
  }
  uVar2 = fnv1a_hash((char *)in_RSI);
  iVar1 = (int)(uVar2 % (ulong)(long)in_RDI[1]);
  if (*(long *)(*(long *)(in_RDI + 2) + (long)iVar1 * 8) != 0) {
    iVar1 = SUNHashMap_Iterate(in_RSI,(int)((ulong)in_RDX >> 0x20),
                               (_func_int_int_SUNHashMapKeyValue_void_ptr *)
                               CONCAT44(iVar1,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
    if (iVar1 < 0) {
      return -1;
    }
    if (iVar1 == in_RDI[1]) {
      return -2;
    }
  }
  puVar3 = (undefined8 *)malloc(0x10);
  if (puVar3 == (undefined8 *)0x0) {
    local_4 = -1;
  }
  else {
    *puVar3 = in_RSI;
    puVar3[1] = in_RDX;
    *(undefined8 **)(*(long *)(in_RDI + 2) + (long)iVar1 * 8) = puVar3;
    *in_RDI = *in_RDI + 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNHashMap_Insert(SUNHashMap map, const char* key, void* value)
{
  int idx;
  int retval;
  SUNHashMapKeyValue kvp;

  if (map == NULL || key == NULL || value == NULL) { return (-1); }

  /* We want the index to be in (0, map->max_size) */
  idx = (int)(fnv1a_hash(key) % map->max_size);

  /* Check if the bucket is already filled */
  if (map->buckets[idx] != NULL)
  {
    /* Find the next open spot */
    retval = SUNHashMap_Iterate(map, idx, sunHashMapLinearProbeInsert, NULL);
    if (retval < 0) { return (-1); /* error occurred */ }
    if (retval == map->max_size) { return (-2); /* no open entry */ }

    idx = retval;
  }

  /* Create the key-value pair */
  kvp = (SUNHashMapKeyValue)malloc(sizeof(*kvp));
  if (kvp == NULL) { return (-1); }

  kvp->key   = key;
  kvp->value = value;

  /* Insert the key-value pair */
  map->buckets[idx] = kvp;
  map->size++;

  return (0);
}